

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

lu_byte luaV_finishget(lua_State *L,TValue *t,TValue *key,StkId val,lu_byte tag)

{
  Table *events;
  lu_byte lVar1;
  TValue *f;
  int iVar2;
  
  iVar2 = 2000;
  while( true ) {
    if (tag == 0x30) {
      f = luaT_gettmbyobj(L,t,TM_INDEX);
      if ((f->tt_ & 0xf) == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    else {
      events = *(Table **)((t->value_).f + 0x20);
      if ((events == (Table *)0x0) || ((events->flags & 1) != 0)) {
        f = (TValue *)0x0;
      }
      else {
        f = luaT_gettm(events,TM_INDEX,L->l_G->tmname[0]);
      }
      if (f == (TValue *)0x0) {
        (val->val).tt_ = '\0';
        return '\0';
      }
    }
    if ((f->tt_ & 0xf) == 6) {
      lVar1 = luaT_callTMres(L,f,t,key,val);
      return lVar1;
    }
    tag = 0x30;
    if (f->tt_ == 0x45) {
      tag = luaH_get((Table *)(f->value_).gc,key,&val->val);
    }
    if ((tag & 0xf) != 0) break;
    iVar2 = iVar2 + -1;
    t = f;
    if (iVar2 == 0) {
      luaG_runerror(L,"\'__index\' chain too long; possible loop");
    }
  }
  return tag;
}

Assistant:

lu_byte luaV_finishget (lua_State *L, const TValue *t, TValue *key,
                                      StkId val, lu_byte tag) {
  int loop;  /* counter to avoid infinite loops */
  const TValue *tm;  /* metamethod */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    if (tag == LUA_VNOTABLE) {  /* 't' is not a table? */
      lua_assert(!ttistable(t));
      tm = luaT_gettmbyobj(L, t, TM_INDEX);
      if (l_unlikely(notm(tm)))
        luaG_typeerror(L, t, "index");  /* no metamethod */
      /* else will try the metamethod */
    }
    else {  /* 't' is a table */
      tm = fasttm(L, hvalue(t)->metatable, TM_INDEX);  /* table's metamethod */
      if (tm == NULL) {  /* no metamethod? */
        setnilvalue(s2v(val));  /* result is nil */
        return LUA_VNIL;
      }
      /* else will try the metamethod */
    }
    if (ttisfunction(tm)) {  /* is metamethod a function? */
      tag = luaT_callTMres(L, tm, t, key, val);  /* call it */
      return tag;  /* return tag of the result */
    }
    t = tm;  /* else try to access 'tm[key]' */
    luaV_fastget(t, key, s2v(val), luaH_get, tag);
    if (!tagisempty(tag))
      return tag;  /* done */
    /* else repeat (tail call 'luaV_finishget') */
  }
  luaG_runerror(L, "'__index' chain too long; possible loop");
  return 0;  /* to avoid warnings */
}